

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int aKey,ByteArray *aValue,int aFlags)

{
  char cVar1;
  uint8_t *data;
  uint8_t *puVar2;
  cn_cbor *value;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  writer local_b8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  parse_func local_40 [1];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  data = (aValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  puVar2 = (aValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (data == puVar2) {
    local_68._0_4_ = none_type;
    pcVar3 = "add empty COSE SIGN1 message attribute";
    local_60._M_p = "add empty COSE SIGN1 message attribute";
    local_58 = 0x26;
    local_50._M_allocated_capacity = 0;
    local_40[0] = (parse_func)0x0;
    local_b8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_68;
    local_50._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_68;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar3,"");
          goto LAB_001fc270;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_b8,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_68);
    } while (pcVar3 != "");
LAB_001fc270:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"add empty COSE SIGN1 message attribute",(string_view)ZEXT816(0x26),
               args);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  else {
    value = cn_cbor_data_create(data,(int)puVar2 - (int)data,(cn_cbor_errback *)0x0);
    if (value != (cn_cbor *)0x0) {
      AddAttribute((Error *)local_68,this,aKey,value,aFlags);
      __return_storage_ptr__->mCode = local_68._0_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mMessage,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p);
      }
      if (value->parent != (cn_cbor *)0x0) {
        return __return_storage_ptr__;
      }
      cn_cbor_free(value);
      return __return_storage_ptr__;
    }
    local_68._0_4_ = none_type;
    pcVar3 = "add COSE SIGN1 message attribute";
    local_60._M_p = "add COSE SIGN1 message attribute";
    local_58 = 0x20;
    local_50._M_allocated_capacity = 0;
    local_40[0] = (parse_func)0x0;
    local_b8.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_68;
    local_50._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_68;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar3,"");
          goto LAB_001fc34e;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_b8,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_68);
    } while (pcVar3 != "");
LAB_001fc34e:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"add COSE SIGN1 message attribute",(string_view)ZEXT816(0x20),
               args_00);
    local_90 = kOutOfMemory;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  __return_storage_ptr__->mCode = local_90;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int aKey, const ByteArray &aValue, int aFlags)
{
    Error    error;
    cn_cbor *cbor = nullptr;

    VerifyOrExit(!aValue.empty(), error = ERROR_INVALID_ARGS("add empty COSE SIGN1 message attribute"));
    cbor = cn_cbor_data_create(&aValue[0], aValue.size(), nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(aKey, cbor, aFlags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}